

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O3

int __thiscall World::GeneratePlayerID(World *this)

{
  int iVar1;
  list<Client_*,_std::allocator<Client_*>_> *__range1;
  list<Client_*,_std::allocator<Client_*>_> *plVar2;
  _List_node_base *p_Var3;
  EOClient *eoclient;
  
  plVar2 = &(this->server->super_Server).clients;
  iVar1 = 1;
  p_Var3 = (_List_node_base *)plVar2;
  while( true ) {
    p_Var3 = (((_List_base<Client_*,_std::allocator<Client_*>_> *)&p_Var3->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    if (p_Var3 == (_List_node_base *)plVar2) break;
    if (*(int *)((long)p_Var3[1]._M_next + 0x110) == iVar1) {
      iVar1 = iVar1 + 1;
      p_Var3 = (_List_node_base *)plVar2;
    }
  }
  return iVar1;
}

Assistant:

int World::GeneratePlayerID()
{
	unsigned int lowest_free_id = 1;
	restart_loop:
	UTIL_FOREACH(this->server->clients, client)
	{
		EOClient *eoclient = static_cast<EOClient *>(client);

		if (eoclient->id == lowest_free_id)
		{
			lowest_free_id = eoclient->id + 1;
			goto restart_loop;
		}
	}
	return lowest_free_id;
}